

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRotUtils.h
# Opt level: O3

ChMatrix33<double> *
chrono::fea::rotutils::Elle
          (ChMatrix33<double> *__return_storage_ptr__,ChVector<double> *phi,ChVector<double> *a)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ActualDstType actualDst;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  double dVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  double coeff [5];
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  ChStarMatrix33<double> local_70;
  
  RotCo<chrono::ChVector<double>,double>(5,phi,phi,&local_98);
  auVar16._8_8_ = 0x8000000000000000;
  auVar16._0_8_ = 0x8000000000000000;
  dVar22 = a->m_data[0];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar22;
  dVar18 = a->m_data[2];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar18;
  auVar2 = *(undefined1 (*) [16])phi->m_data;
  dVar1 = phi->m_data[2];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar1;
  dVar19 = phi->m_data[1];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar19;
  local_90 = -local_90;
  dVar23 = a->m_data[1];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar23;
  auVar46._0_8_ = -(dVar22 * local_90);
  auVar46._8_8_ = 0x8000000000000000;
  auVar47 = vpslldq_avx(auVar46,8);
  auVar41._0_8_ = -(dVar18 * local_90);
  auVar41._8_8_ = 0x8000000000000000;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar18 * local_90;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar23 * local_90;
  auVar15 = vunpcklpd_avx(auVar9,auVar7);
  auVar33._0_8_ = -(dVar23 * local_90);
  auVar33._8_8_ = 0x8000000000000000;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar22 * local_90;
  auVar3 = vunpcklpd_avx(auVar33,auVar8);
  auVar42 = vpslldq_avx(auVar41,8);
  dVar30 = dVar18 * local_88;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar22 * local_88;
  auVar4 = vmulsd_avx512f(auVar48,auVar2);
  dVar55 = auVar2._0_8_;
  auVar5 = vmulsd_avx512f(auVar48,auVar53);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar22 * local_88;
  auVar6 = vmulsd_avx512f(auVar56,auVar49);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar23 * local_88;
  auVar7 = vmulsd_avx512f(auVar52,auVar56);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar30;
  auVar8 = vmovddup_avx512vl(auVar34);
  auVar9 = vmulpd_avx512vl(auVar8,auVar2);
  auVar8 = vfnmsub231sd_avx512f(auVar4,auVar53,auVar34);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar23 * local_88 * dVar55;
  auVar10 = vunpcklpd_avx512vl(auVar5,auVar57);
  auVar5 = vmulsd_avx512f(auVar52,auVar53);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar1 * dVar30;
  auVar4 = vfnmsub231sd_fma(auVar54,auVar56,auVar52);
  auVar11 = vfmsub213sd_avx512f(auVar52,auVar2,auVar6);
  auVar12 = vfnmsub231sd_avx512f(auVar7,auVar2,auVar49);
  auVar13 = vunpcklpd_avx512vl(auVar8,auVar5);
  auVar14 = vfmsub231sd_avx512f(auVar5,auVar56,auVar34);
  auVar4 = vunpcklpd_avx512vl(auVar4,auVar6);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar55 * dVar30;
  auVar5 = vfmsub231sd_fma(auVar35,auVar53,auVar49);
  auVar50._0_8_ = auVar11._0_8_ ^ 0x8000000000000000;
  auVar50._8_8_ = auVar11._8_8_ ^ 0x8000000000000000;
  auVar6 = vpslldq_avx(auVar50,8);
  auVar51._0_8_ = auVar6._0_8_ + auVar4._0_8_;
  auVar51._8_8_ = auVar6._8_8_ + auVar4._8_8_;
  auVar7 = vsubpd_avx(auVar42,auVar51);
  auVar4 = vunpcklpd_avx(auVar5,auVar11);
  auVar43._0_8_ = auVar10._0_8_ + auVar4._0_8_;
  auVar43._8_8_ = auVar10._8_8_ + auVar4._8_8_;
  auVar8 = vsubpd_avx(auVar15,auVar43);
  auVar15 = vxorpd_avx512vl(auVar14,auVar16);
  auVar10._0_8_ = auVar5._0_8_ ^ 0x8000000000000000;
  auVar10._8_8_ = auVar5._8_8_ ^ 0x8000000000000000;
  auVar4 = vunpcklpd_avx512vl(auVar10,auVar14);
  auVar5 = vpslldq_avx(auVar15,8);
  auVar15 = vaddpd_avx512vl(auVar9,auVar4);
  auVar4 = vaddpd_avx512vl(auVar5,auVar13);
  auVar9 = vsubpd_avx(auVar3,auVar15);
  auVar10 = vsubpd_avx(auVar47,auVar4);
  auVar16 = vaddsd_avx512f(auVar12,ZEXT816(0) << 0x40);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar55 * dVar18;
  auVar15 = vfmsub231sd_fma(auVar26,auVar53,auVar20);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar19 * dVar22;
  auVar2 = vfmsub231sd_fma(auVar11,auVar2,auVar17);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar1 * dVar23;
  auVar3 = vfmsub231sd_fma(auVar12,auVar56,auVar37);
  dVar55 = dVar55 * local_80;
  dVar19 = dVar19 * local_80;
  dVar1 = dVar1 * local_80;
  dVar22 = auVar3._0_8_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar22 * dVar55;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar22 * dVar19;
  auVar11 = vunpcklpd_avx(auVar38,auVar44);
  dVar23 = auVar15._0_8_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar22 * dVar1;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar55 * dVar23;
  auVar12 = vunpcklpd_avx(auVar13,auVar39);
  dVar18 = auVar2._0_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar19 * dVar23;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar1 * dVar23;
  auVar13 = vunpcklpd_avx(auVar14,auVar27);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar18 * dVar55;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar18 * dVar19;
  auVar14 = vunpcklpd_avx(auVar24,auVar28);
  ChStarMatrix33<double>::ChStarMatrix33(&local_70,phi,phi);
  dVar22 = a->m_data[1];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = a->m_data[0];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = a->m_data[2];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       dVar22 * local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [1];
  auVar2 = vfmadd231sd_fma(auVar25,auVar42,auVar2);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       dVar22 * local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar15 = vfmadd231sd_fma(auVar31,auVar42,auVar15);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       dVar22 * local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7];
  auVar3 = vfmadd231sd_fma(auVar21,auVar42,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar2 = vfmadd231sd_fma(auVar2,auVar29,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar15 = vfmadd231sd_fma(auVar15,auVar29,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar3 = vfmadd231sd_fma(auVar3,auVar29,auVar6);
  dVar22 = local_78 * phi->m_data[2];
  auVar47._0_8_ = local_78 * phi->m_data[0];
  auVar47._8_8_ = local_78 * phi->m_data[1];
  dVar23 = auVar2._0_8_;
  dVar30 = auVar15._0_8_;
  local_118 = auVar11._0_8_;
  dStack_110 = auVar11._8_8_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar23 * dVar22;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar30 * auVar47._0_8_;
  auVar15 = vunpcklpd_avx(auVar36,auVar45);
  auVar2 = vshufpd_avx(auVar47,auVar47,1);
  local_108 = auVar12._0_8_;
  dStack_100 = auVar12._8_8_;
  dVar19 = auVar3._0_8_;
  local_d8 = auVar7._0_8_;
  dStack_d0 = auVar7._8_8_;
  local_e8 = auVar14._0_8_;
  dStack_e0 = auVar14._8_8_;
  local_c8 = auVar8._0_8_;
  dStack_c0 = auVar8._8_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar30 * auVar2._0_8_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar30 * dVar22;
  auVar2 = vunpcklpd_avx(auVar32,auVar40);
  local_f8 = auVar13._0_8_;
  dStack_f0 = auVar13._8_8_;
  local_b8 = auVar9._0_8_;
  dStack_b0 = auVar9._8_8_;
  local_a8 = auVar10._0_8_;
  dStack_a0 = auVar10._8_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       dVar23 * auVar47._0_8_ + local_118 + local_d8;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       dVar23 * auVar47._8_8_ + dStack_110 + dStack_d0;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar15._0_8_ + local_108 + local_c8;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       auVar15._8_8_ + dStack_100 + dStack_c0;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar2._0_8_ + local_f8 + local_a8;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar2._8_8_ + dStack_f0 + dStack_a0;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       dVar19 * auVar47._0_8_ + local_e8 + local_b8;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       dVar19 * auVar47._8_8_ + dStack_e0 + dStack_b0;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       dVar19 * dVar22 + dVar18 * dVar1 + (0.0 - auVar16._0_8_);
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> Elle(const ChVector<>& phi, const ChVector<>& a) {
    double coeff[COEFF_E];
    CoeffE(phi, phi, coeff);

    ChStarMatrix33<> L(a * (-coeff[1]));
    L -= ChStarMatrix33<>(phi, a * coeff[2]) + ChStarMatrix33<>(Vcross(phi, a * coeff[2]));
    L += TensorProduct(Vcross(phi, a), phi * coeff[3]) + TensorProduct(ChStarMatrix33<>(phi, phi) * a, phi * coeff[4]);

    return L;
}